

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

UGroupingStrategy icu_63::number::impl::stem_to_object::groupingStrategy(StemEnum stem)

{
  UGroupingStrategy local_c;
  StemEnum stem_local;
  
  switch(stem) {
  case STEM_GROUP_OFF:
    local_c = UNUM_GROUPING_OFF;
    break;
  case STEM_GROUP_MIN2:
    local_c = UNUM_GROUPING_MIN2;
    break;
  case STEM_GROUP_AUTO:
    local_c = UNUM_GROUPING_AUTO;
    break;
  case STEM_GROUP_ON_ALIGNED:
    local_c = UNUM_GROUPING_ON_ALIGNED;
    break;
  case STEM_GROUP_THOUSANDS:
    local_c = UNUM_GROUPING_THOUSANDS;
    break;
  default:
    local_c = UNUM_GROUPING_COUNT;
  }
  return local_c;
}

Assistant:

UGroupingStrategy stem_to_object::groupingStrategy(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_GROUP_OFF:
            return UNUM_GROUPING_OFF;
        case STEM_GROUP_MIN2:
            return UNUM_GROUPING_MIN2;
        case STEM_GROUP_AUTO:
            return UNUM_GROUPING_AUTO;
        case STEM_GROUP_ON_ALIGNED:
            return UNUM_GROUPING_ON_ALIGNED;
        case STEM_GROUP_THOUSANDS:
            return UNUM_GROUPING_THOUSANDS;
        default:
            return UNUM_GROUPING_COUNT; // for objects, throw; for enums, return COUNT
    }
}